

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_fold3_key.c
# Opt level: O2

int onigenc_unicode_fold3_key(OnigCodePoint *codes)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = onig_codes_byte_at(codes,8);
  bVar1 = hash_asso_values[uVar4 & 0xff];
  uVar4 = onig_codes_byte_at(codes,5);
  bVar2 = hash_asso_values[uVar4 & 0xff];
  uVar4 = onig_codes_byte_at(codes,2);
  uVar4 = (uint)(byte)hash_asso_values[uVar4 & 0xff] + (uint)bVar2 + (uint)bVar1;
  if (uVar4 < 0xe) {
    sVar3 = onigenc_unicode_fold3_key::wordlist[uVar4];
    iVar5 = onig_codes_cmp(codes,OnigUnicodeFolds3 + (uint)(int)sVar3,3);
    uVar4 = -(uint)(iVar5 != 0) | (int)sVar3;
  }
  else {
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

int
onigenc_unicode_fold3_key(OnigCodePoint codes[])
{
  static const short int wordlist[] =
    {

      62,

      47,

      31,

      57,

      41,

      25,

      52,

      36,

      20,

      67,

      15,

      10,

      5,

      0
    };


    {
      int key = hash(codes);

      if (key <= MAX_HASH_VALUE)
        {
          int index = wordlist[key];

          if (index >= 0 && onig_codes_cmp(codes, OnigUnicodeFolds3 + index, 3) == 0)
            return index;
        }
    }
  return -1;
}